

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O0

void __thiscall
duckdb::DuckTableScanState::TableScanFunc
          (DuckTableScanState *this,ClientContext *context,TableFunctionInput *data_p,
          DataChunk *output)

{
  bool bVar1;
  int iVar2;
  DataChunk *other;
  DuckTableEntry *this_00;
  DuckTransaction *transaction;
  undefined4 extraout_var;
  TableScanLocalState *state;
  ClientConfig *pCVar3;
  idx_t iVar4;
  DataChunk *in_RCX;
  ClientContext *in_RSI;
  Catalog *in_RDI;
  ClientContext *unaff_retaddr;
  bool next;
  TableScanLocalState *l_state;
  DataTable *storage;
  DuckTransaction *tx;
  DuckTableEntry *duck_table;
  TableScanBindData *bind_data;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  Catalog *catalog;
  ClientContext *context_00;
  
  catalog = in_RDI;
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  other = (DataChunk *)
          FunctionData::Cast<duckdb::TableScanBindData>
                    ((FunctionData *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  this_00 = CatalogEntry::Cast<duckdb::DuckTableEntry>
                      ((CatalogEntry *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                      );
  transaction = DuckTransaction::Get(unaff_retaddr,catalog);
  iVar2 = (*(this_00->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  context_00 = (ClientContext *)CONCAT44(extraout_var,iVar2);
  optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  state = LocalTableFunctionState::Cast<duckdb::TableScanLocalState>
                    ((LocalTableFunctionState *)
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  pCVar3 = ClientConfig::GetConfig(in_RSI);
  (state->scan_state).options.force_fetch_row = (bool)(pCVar3->force_fetch_row & 1);
  do {
    if (((ulong)(other->vector_caches).
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_start & 0x100) == 0) {
      bVar1 = TableScanGlobalState::CanRemoveFilterColumns((TableScanGlobalState *)0x14dc6b8);
      if (bVar1) {
        DataChunk::Reset((DataChunk *)l_state);
        DataTable::Scan((DataTable *)this_00,transaction,(DataChunk *)context_00,
                        (TableScanState *)state);
        DataChunk::ReferenceColumns(in_RCX,other,(vector<unsigned_long,_true> *)this_00);
      }
      else {
        DataTable::Scan((DataTable *)this_00,transaction,(DataChunk *)context_00,
                        (TableScanState *)state);
      }
    }
    else {
      DataTable::CreateIndexScan
                ((DataTable *)context_00,(TableScanState *)state,
                 (DataChunk *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 (TableScanType)((ulong)in_RDI >> 0x38));
    }
    iVar4 = DataChunk::size(in_RCX);
  } while ((iVar4 == 0) &&
          (in_stack_ffffffffffffffb7 =
                DataTable::NextParallelScan
                          ((DataTable *)transaction,context_00,(ParallelTableScanState *)state,
                           (TableScanState *)
                           CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)),
          (bool)in_stack_ffffffffffffffb7));
  return;
}

Assistant:

void TableScanFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) override {
		auto &bind_data = data_p.bind_data->Cast<TableScanBindData>();
		auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
		auto &tx = DuckTransaction::Get(context, duck_table.catalog);
		auto &storage = duck_table.GetStorage();

		auto &l_state = data_p.local_state->Cast<TableScanLocalState>();
		l_state.scan_state.options.force_fetch_row = ClientConfig::GetConfig(context).force_fetch_row;

		do {
			if (bind_data.is_create_index) {
				storage.CreateIndexScan(l_state.scan_state, output,
				                        TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED);
			} else if (CanRemoveFilterColumns()) {
				l_state.all_columns.Reset();
				storage.Scan(tx, l_state.all_columns, l_state.scan_state);
				output.ReferenceColumns(l_state.all_columns, projection_ids);
			} else {
				storage.Scan(tx, output, l_state.scan_state);
			}
			if (output.size() > 0) {
				return;
			}

			auto next = storage.NextParallelScan(context, state, l_state.scan_state);
			if (!next) {
				return;
			}
		} while (true);
	}